

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O1

void __thiscall QPrinter::setOutputFileName(QPrinter *this,QString *fileName)

{
  QPrinterPrivate *pQVar1;
  int iVar2;
  OutputFormat format;
  long in_FS_OFFSET;
  QLatin1String QVar3;
  QFileInfo fi;
  PrintEnginePropertyKey copy;
  undefined8 local_68;
  QHashDummyValue local_5d;
  PrintEnginePropertyKey local_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  iVar2 = (*pQVar1->printEngine->_vptr_QPrintEngine[7])();
  if (iVar2 == 1) {
    setOutputFileName();
    goto LAB_00133983;
  }
  local_68 = 0xaaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&local_68,fileName);
  QFileInfo::suffix();
  QVar3.m_data = (char *)0x3;
  QVar3.m_size = (qsizetype)&local_58;
  iVar2 = QString::compare(QVar3,0x158102);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  if (iVar2 == 0) {
    format = PdfFormat;
LAB_0013392d:
    setOutputFormat(this,format);
  }
  else if ((fileName->d).size == 0) {
    format = NativeFormat;
    goto LAB_0013392d;
  }
  QVariant::QVariant((QVariant *)&local_58,fileName);
  (*pQVar1->printEngine->_vptr_QPrintEngine[2])(pQVar1->printEngine,7,&local_58);
  local_5c = PPK_OutputFileName;
  QHash<QPrintEngine::PrintEnginePropertyKey,QHashDummyValue>::emplace<QHashDummyValue_const&>
            ((QHash<QPrintEngine::PrintEnginePropertyKey,QHashDummyValue> *)&pQVar1->m_properties,
             &local_5c,&local_5d);
  QVariant::~QVariant((QVariant *)&local_58);
  QFileInfo::~QFileInfo((QFileInfo *)&local_68);
LAB_00133983:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrinter::setOutputFileName(const QString &fileName)
{
    Q_D(QPrinter);
    ABORT_IF_ACTIVE("QPrinter::setOutputFileName");

    QFileInfo fi(fileName);
    if (!fi.suffix().compare("pdf"_L1, Qt::CaseInsensitive))
        setOutputFormat(QPrinter::PdfFormat);
    else if (fileName.isEmpty())
        setOutputFormat(QPrinter::NativeFormat);

    d->setProperty(QPrintEngine::PPK_OutputFileName, fileName);
}